

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void walIndexWriteHdr(Wal *pWal)

{
  u32 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  u32 uVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  
  puVar1 = *pWal->apWiData;
  (pWal->hdr).isInit = '\x01';
  (pWal->hdr).iVersion = 0x2de218;
  walChecksumBytes(1,(u8 *)&pWal->hdr,0x28,(u32 *)0x0,(pWal->hdr).aCksum);
  uVar7 = (pWal->hdr).iVersion;
  uVar8 = (pWal->hdr).unused;
  uVar2 = *(undefined8 *)&(pWal->hdr).iChange;
  uVar5 = (pWal->hdr).mxFrame;
  uVar6 = (pWal->hdr).nPage;
  uVar3 = *(undefined8 *)(pWal->hdr).aFrameCksum;
  uVar4 = *(undefined8 *)(pWal->hdr).aCksum;
  *(undefined8 *)(puVar1 + 0x14) = *(undefined8 *)(pWal->hdr).aSalt;
  *(undefined8 *)(puVar1 + 0x16) = uVar4;
  puVar1[0x10] = uVar5;
  puVar1[0x11] = uVar6;
  *(undefined8 *)(puVar1 + 0x12) = uVar3;
  puVar1[0xc] = uVar7;
  puVar1[0xd] = uVar8;
  *(undefined8 *)(puVar1 + 0xe) = uVar2;
  walShmBarrier(pWal);
  uVar7 = (pWal->hdr).iVersion;
  uVar8 = (pWal->hdr).unused;
  uVar2 = *(undefined8 *)&(pWal->hdr).iChange;
  uVar5 = (pWal->hdr).mxFrame;
  uVar6 = (pWal->hdr).nPage;
  uVar3 = *(undefined8 *)(pWal->hdr).aFrameCksum;
  uVar4 = *(undefined8 *)(pWal->hdr).aCksum;
  *(undefined8 *)(puVar1 + 8) = *(undefined8 *)(pWal->hdr).aSalt;
  *(undefined8 *)(puVar1 + 10) = uVar4;
  puVar1[4] = uVar5;
  puVar1[5] = uVar6;
  *(undefined8 *)(puVar1 + 6) = uVar3;
  puVar1[0] = uVar7;
  puVar1[1] = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar2;
  return;
}

Assistant:

static SQLITE_NO_TSAN void walIndexWriteHdr(Wal *pWal){
  volatile WalIndexHdr *aHdr = walIndexHdr(pWal);
  const int nCksum = offsetof(WalIndexHdr, aCksum);

  assert( pWal->writeLock );
  pWal->hdr.isInit = 1;
  pWal->hdr.iVersion = WALINDEX_MAX_VERSION;
  walChecksumBytes(1, (u8*)&pWal->hdr, nCksum, 0, pWal->hdr.aCksum);
  /* Possible TSAN false-positive.  See tag-20200519-1 */
  memcpy((void*)&aHdr[1], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
  walShmBarrier(pWal);
  memcpy((void*)&aHdr[0], (const void*)&pWal->hdr, sizeof(WalIndexHdr));
}